

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_finally(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  int64_t iVar6;
  int64_t *piVar7;
  long lVar8;
  JSValue v;
  JSValue this_val_00;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar9;
  JSValue JVar10;
  JSValue JVar11;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  int64_t local_70;
  int64_t local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  local_50 = local_58;
  iVar6 = this_val.tag;
  local_60 = this_val.u;
  JVar1 = (JSValueUnion)(argv->u).ptr;
  iVar2 = argv->tag;
  JVar9 = *argv;
  JVar10 = JS_SpeciesConstructor(ctx,this_val,(JSValue)(ZEXT816(3) << 0x40));
  local_70 = JVar10.tag;
  JVar4 = JVar10.u;
  if ((int)JVar10.tag == 6) {
    uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
  }
  else {
    iVar3 = JS_IsFunction(ctx,JVar9);
    local_68 = iVar6;
    if (iVar3 == 0) {
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
      local_58.ptr = JVar1.ptr;
      local_98 = JVar1;
      local_90 = iVar2;
      local_88 = JVar1;
      local_80 = iVar2;
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
    }
    else {
      piVar7 = &local_90;
      lVar8 = 0;
      _local_58 = JVar10;
      local_48 = JVar1;
      local_40 = iVar2;
      do {
        JVar10 = JS_NewCFunctionData(ctx,js_promise_then_finally_func,1,(int)lVar8,2,
                                     (JSValue *)&local_58);
        *(JSValueUnion *)(piVar7 + -1) = JVar10.u;
        *piVar7 = JVar10.tag;
        iVar2 = local_70;
        if ((int)JVar10.tag == 6) {
          if (((lVar8 == 1) && (0xfffffff4 < (uint)local_90)) &&
             (iVar3 = *local_98.ptr, *(int *)local_98.ptr = iVar3 + -1, iVar3 < 2)) {
            JVar10.tag = local_90;
            JVar10.u.ptr = local_98.ptr;
            __JS_FreeValueRT(ctx->rt,JVar10);
          }
          if ((0xfffffff4 < (uint)iVar2) &&
             (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
            JVar9.tag = iVar2;
            JVar9.u.ptr = JVar4.ptr;
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
          JVar10 = (JSValue)(ZEXT816(6) << 0x40);
          uVar5 = 0;
          goto LAB_0014a4ac;
        }
        lVar8 = lVar8 + 1;
        piVar7 = piVar7 + 2;
      } while (lVar8 == 1);
    }
    if ((0xfffffff4 < (uint)local_70) &&
       (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
      v.tag = local_70;
      v.u.ptr = JVar4.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    this_val_00.tag = local_68;
    this_val_00.u.float64 = local_60.float64;
    JVar10 = JS_Invoke(ctx,this_val_00,0x7f,2,(JSValue *)&local_98);
    if ((0xfffffff4 < (uint)local_90) &&
       (iVar3 = *local_98.ptr, *(int *)local_98.ptr = iVar3 + -1, iVar3 < 2)) {
      v_00.tag = local_90;
      v_00.u.ptr = local_98.ptr;
      __JS_FreeValueRT(ctx->rt,v_00);
    }
    if ((0xfffffff4 < (uint)local_80) &&
       (iVar3 = *local_88.ptr, *(int *)local_88.ptr = iVar3 + -1, iVar3 < 2)) {
      v_01.tag = local_80;
      v_01.u.ptr = local_88.ptr;
      __JS_FreeValueRT(ctx->rt,v_01);
    }
    uVar5 = (ulong)JVar10.u.ptr & 0xffffffff00000000;
  }
LAB_0014a4ac:
  JVar11.u.ptr = (void *)((ulong)JVar10.u.ptr & 0xffffffff | uVar5);
  JVar11.tag = JVar10.tag;
  return JVar11;
}

Assistant:

static JSValue js_promise_finally(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst onFinally = argv[0];
    JSValue ctor, ret;
    JSValue then_funcs[2];
    JSValueConst func_data[2];
    int i;

    ctor = JS_SpeciesConstructor(ctx, this_val, JS_UNDEFINED);
    if (JS_IsException(ctor))
        return ctor;
    if (!JS_IsFunction(ctx, onFinally)) {
        then_funcs[0] = JS_DupValue(ctx, onFinally);
        then_funcs[1] = JS_DupValue(ctx, onFinally);
    } else {
        func_data[0] = ctor;
        func_data[1] = onFinally;
        for(i = 0; i < 2; i++) {
            then_funcs[i] = JS_NewCFunctionData(ctx, js_promise_then_finally_func, 1, i, 2, func_data);
            if (JS_IsException(then_funcs[i])) {
                if (i == 1)
                    JS_FreeValue(ctx, then_funcs[0]);
                JS_FreeValue(ctx, ctor);
                return JS_EXCEPTION;
            }
        }
    }
    JS_FreeValue(ctx, ctor);
    ret = JS_Invoke(ctx, this_val, JS_ATOM_then, 2, (JSValueConst *)then_funcs);
    JS_FreeValue(ctx, then_funcs[0]);
    JS_FreeValue(ctx, then_funcs[1]);
    return ret;
}